

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Film::readFrom(Film *this,BinaryReader *binary)

{
  size_t in_RCX;
  void *__buf;
  
  BinaryReader::read<pbrt::math::vec2i,void>(binary,&this->resolution);
  BinaryReader::read(binary,(int)this + 0x20,__buf,in_RCX);
  return;
}

Assistant:

void Film::readFrom(BinaryReader &binary) 
  {
    binary.read(resolution);
    binary.read(fileName);
  }